

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O1

void __thiscall Webcam::Webcam(Webcam *this,char *devName,uint width,uint height)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int *piVar6;
  undefined8 extraout_RAX;
  long lVar7;
  stat *arg;
  Webcam *this_00;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  v4l2_requestbuffers req;
  v4l2_buf_type type;
  v4l2_crop crop;
  v4l2_cropcap cropcap;
  v4l2_capability cap;
  undefined1 auStack_24c [4];
  uint *puStack_248;
  Webcam *pWStack_240;
  ulong local_238 [2];
  undefined4 local_228;
  uint local_218;
  undefined4 uStack_214;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  undefined8 local_1c8;
  stat local_1b8;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 local_ac;
  undefined4 uStack_a8;
  undefined8 uStack_a4;
  undefined1 local_90 [84];
  uint local_3c;
  
  arg = (stat *)(ulong)height;
  this->isOpen = false;
  pWStack_240 = (Webcam *)0x1177fb;
  dev_name = devName;
  iVar3 = stat(devName,&local_1b8);
  if (iVar3 == -1) {
    pWStack_240 = (Webcam *)0x117b96;
    Webcam((Webcam *)devName);
LAB_00117ba4:
    this->isOpen = false;
    return;
  }
  if ((local_1b8.st_mode & 0xf000) != 0x2000) {
    pWStack_240 = (Webcam *)0x117b9d;
    Webcam((Webcam *)devName);
    goto LAB_00117ba4;
  }
  pWStack_240 = (Webcam *)0x117830;
  this_00 = (Webcam *)dev_name;
  fd = open(dev_name,0x802,0);
  if (fd == -1) {
    pWStack_240 = (Webcam *)0x117ba4;
    Webcam(this_00);
    goto LAB_00117ba4;
  }
  this->isOpen = true;
  pcVar8 = (char *)(ulong)(uint)fd;
  pWStack_240 = (Webcam *)0x11785b;
  iVar3 = xioctl(fd,-0x7f97aa00,local_90);
  if (iVar3 == -1) goto LAB_00117bce;
  if ((local_3c & 1) == 0) goto LAB_00117bdd;
  if ((local_3c >> 0x1a & 1) == 0) goto LAB_00117be2;
  uStack_c0 = 0;
  uStack_a8 = 0;
  uStack_a4 = 0;
  uStack_b8 = 0;
  uStack_b4 = 0;
  uStack_b0 = 0;
  local_ac = 0;
  local_c8 = 1;
  pWStack_240 = (Webcam *)0x1178a9;
  iVar3 = xioctl(fd,-0x3fd3a9c6,&local_c8);
  if (iVar3 == 0) {
    local_dc = 1;
    local_d8 = CONCAT44(uStack_b0,uStack_b4);
    uStack_d0 = CONCAT44(uStack_a8,local_ac);
    pWStack_240 = (Webcam *)0x1178d7;
    xioctl(fd,0x4014563c,&local_dc);
  }
  this = (Webcam *)&local_1b8;
  pWStack_240 = (Webcam *)0x1178ee;
  memset(this,0,0xd0);
  local_1b8.st_dev = CONCAT44(local_1b8.st_dev._4_4_,1);
  local_1b8.st_ino = CONCAT44(height,width);
  local_1b8.st_nlink = 0x447504a4d;
  pWStack_240 = (Webcam *)0x11791e;
  iVar3 = xioctl(fd,-0x3f2fa9fb,this);
  if (iVar3 == -1) goto LAB_00117be7;
  iVar3 = (int)local_1b8.st_ino;
  this = (Webcam *)(local_1b8.st_ino & 0xffffffff);
  iVar2 = local_1b8.st_ino._4_4_;
  if (local_1b8.st_mode < (uint)((int)local_1b8.st_ino * 2)) {
    local_1b8.st_mode = (int)local_1b8.st_ino * 2;
  }
  if (local_1b8.st_uid < local_1b8.st_mode * local_1b8.st_ino._4_4_) {
    local_1b8.st_uid = local_1b8.st_mode * local_1b8.st_ino._4_4_;
  }
  local_228 = 0;
  local_238[0] = 0x100000004;
  local_238[1] = 1;
  pcVar8 = (char *)(ulong)(uint)fd;
  pWStack_240 = (Webcam *)0x117998;
  iVar4 = xioctl(fd,-0x3feba9f8,local_238);
  if (iVar4 == -1) goto LAB_00117bf3;
  pcVar8 = (char *)(local_238[0] & 0xffffffff);
  if (pcVar8 < (Webcam *)0x2) goto LAB_00117c02;
  pWStack_240 = (Webcam *)0x1179b8;
  buffers = (buffer *)calloc((size_t)pcVar8,0x10);
  if (buffers == (buffer *)0x0) goto LAB_00117c07;
  n_buffers = 0;
  arg = (stat *)&local_218;
  do {
    uStack_210 = 0;
    local_1e8 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    local_1f8._0_4_ = 0;
    local_1f8._4_4_ = 0;
    uStack_1f0 = 0;
    local_208 = 0;
    uStack_200._0_4_ = 0;
    uStack_200._4_4_ = 0;
    local_1c8 = 0;
    uStack_1e0 = 0x100000000;
    _local_218 = CONCAT44(1,n_buffers);
    pWStack_240 = (Webcam *)0x117a25;
    iVar4 = xioctl(fd,-0x3fa7a9f7,arg);
    if (iVar4 == -1) {
      pWStack_240 = (Webcam *)0x117bb6;
      errno_exit("VIDIOC_QUERYBUF");
LAB_00117bb6:
      pWStack_240 = (Webcam *)0x117bc2;
      errno_exit("mmap");
      goto LAB_00117bc2;
    }
    buffers[n_buffers].length = uStack_1d0 & 0xffffffff;
    pWStack_240 = (Webcam *)0x117a65;
    pvVar5 = mmap((void *)0x0,uStack_1d0 & 0xffffffff,3,1,fd,local_1d8 & 0xffffffff);
    uVar10 = n_buffers;
    uVar9 = (ulong)n_buffers;
    buffers[uVar9].start = pvVar5;
    if (buffers[uVar9].start == (void *)0xffffffffffffffff) goto LAB_00117bb6;
    n_buffers = uVar10 + 1;
  } while (n_buffers < (uint)local_238[0]);
  if (n_buffers != 0) {
    uVar10 = 0;
    arg = &local_1b8;
    do {
      local_1b8.st_ino = 0;
      local_1b8.st_size = 0;
      local_1b8.st_blocks = 0;
      local_1b8.st_atim.tv_sec = 0;
      local_1b8.st_gid = 0;
      local_1b8.__pad0 = 0;
      local_1b8.st_rdev = 0;
      local_1b8.st_nlink = 0;
      local_1b8.st_mode = 0;
      local_1b8.st_uid = 0;
      local_1b8.st_atim.tv_nsec = 0;
      local_1b8.st_blksize = 0x100000000;
      local_1b8.st_dev = CONCAT44(1,uVar10);
      pWStack_240 = (Webcam *)0x117b1b;
      iVar4 = xioctl(fd,-0x3fa7a9f1,arg);
      if (iVar4 == -1) goto LAB_00117bc2;
      uVar10 = uVar10 + 1;
    } while (uVar10 < n_buffers);
  }
  local_1b8.st_dev = CONCAT44(local_1b8.st_dev._4_4_,1);
  pWStack_240 = (Webcam *)0x117b4e;
  iVar4 = xioctl(fd,0x40045612,&local_1b8);
  if (iVar4 != -1) {
    sVar1 = buffers->length;
    lVar7 = 0;
    do {
      *(int *)((long)&imgBuffer[0].size + lVar7) = (int)sVar1;
      *(int *)((long)&imgBuffer[0].width + lVar7) = iVar3;
      *(int *)((long)&imgBuffer[0].height + lVar7) = iVar2;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 == 0x18);
    return;
  }
LAB_00117c0c:
  pWStack_240 = (Webcam *)0x117c18;
  errno_exit("VIDIOC_STREAMON");
  goto LAB_00117c18;
LAB_00117bc2:
  pcVar8 = "VIDIOC_QBUF";
  pWStack_240 = (Webcam *)0x117bce;
  errno_exit("VIDIOC_QBUF");
LAB_00117bce:
  pWStack_240 = (Webcam *)0x117bd3;
  piVar6 = __errno_location();
  if (*piVar6 == 0x16) {
    pWStack_240 = (Webcam *)0x117bdd;
    Webcam((Webcam *)pcVar8);
LAB_00117bdd:
    pWStack_240 = (Webcam *)0x117be2;
    Webcam((Webcam *)pcVar8);
LAB_00117be2:
    pWStack_240 = (Webcam *)0x117be7;
    Webcam((Webcam *)pcVar8);
LAB_00117be7:
    pcVar8 = "VIDIOC_S_FMT";
    pWStack_240 = (Webcam *)0x117bf3;
    errno_exit("VIDIOC_S_FMT");
LAB_00117bf3:
    pWStack_240 = (Webcam *)0x117bf8;
    piVar6 = __errno_location();
    if (*piVar6 != 0x16) goto LAB_00117c24;
    pWStack_240 = (Webcam *)0x117c02;
    Webcam((Webcam *)pcVar8);
LAB_00117c02:
    pWStack_240 = (Webcam *)0x117c07;
    Webcam((Webcam *)pcVar8);
LAB_00117c07:
    pWStack_240 = (Webcam *)0x117c0c;
    Webcam((Webcam *)pcVar8);
    goto LAB_00117c0c;
  }
LAB_00117c18:
  pWStack_240 = (Webcam *)0x117c24;
  errno_exit("VIDIOC_QUERYCAP");
LAB_00117c24:
  pcVar8 = "VIDIOC_REQBUFS";
  pWStack_240 = (Webcam *)~Webcam;
  errno_exit("VIDIOC_REQBUFS");
  if (*pcVar8 != '\x01') {
    return;
  }
  puStack_248 = (uint *)arg;
  pWStack_240 = this;
  if (((byte)isRun._M_base._M_i & 1) != 0) {
    LOCK();
    isRun._M_base._M_i = (__atomic_base<bool>)false;
    UNLOCK();
    std::thread::join();
  }
  iVar3 = xioctl(fd,0x40045613,auStack_24c);
  if (iVar3 == -1) {
LAB_00117cf2:
    errno_exit("VIDIOC_STREAMOFF");
  }
  else {
    if (n_buffers != 0) {
      lVar7 = 8;
      uVar9 = 0;
      do {
        iVar3 = munmap(*(void **)((long)buffers + lVar7 + -8),
                       *(size_t *)((long)&buffers->start + lVar7));
        if (iVar3 == -1) {
          errno_exit("munmap");
          goto LAB_00117cf2;
        }
        uVar9 = uVar9 + 1;
        lVar7 = lVar7 + 0x10;
      } while (uVar9 < n_buffers);
    }
    free(buffers);
    iVar3 = close(fd);
    if (iVar3 != -1) {
      fd = -1;
      return;
    }
  }
  errno_exit("close");
  __clang_call_terminate(extraout_RAX);
  if (((byte)isRun._M_base._M_i & 1) == 0) {
    return;
  }
  LOCK();
  isRun._M_base._M_i = (__atomic_base<bool>)false;
  UNLOCK();
  std::thread::join();
  return;
}

Assistant:

Webcam::Webcam(const char *devName, unsigned int width, unsigned int height)
{
    dev_name = (char *)devName;
    if(!open_device()) {
        isOpen = false;
        return;
    }
    isOpen = true;
    init_device (width, height);    //此处 若不适配的分辨率会自动被更正
    start_capturing ();

    for(int i=0; i<2; i++) {
        imgBuffer[i].size = buffers[0].length;
        imgBuffer[i].width  = width;
        imgBuffer[i].height = height;
    }
}